

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collation.cpp
# Opt level: O0

uint32_t icu_63::Collation::decThreeBytePrimaryByOneStep
                   (uint32_t basePrimary,UBool isCompressible,int32_t step)

{
  int iVar1;
  undefined4 local_20;
  int32_t byte2;
  int32_t byte3;
  int32_t step_local;
  uint uStack_c;
  UBool isCompressible_local;
  uint32_t basePrimary_local;
  
  iVar1 = (basePrimary >> 8 & 0xff) - step;
  if (iVar1 < 2) {
    local_20 = (basePrimary >> 0x10 & 0xff) - 1;
    step_local = basePrimary;
    if (isCompressible == '\0') {
      if (local_20 < 2) {
        local_20 = 0xff;
        step_local = basePrimary - 0x1000000;
      }
    }
    else if (local_20 < 4) {
      local_20 = 0xfe;
      step_local = basePrimary - 0x1000000;
    }
    uStack_c = step_local & 0xff000000U | local_20 << 0x10 | (iVar1 + 0xfe) * 0x100;
  }
  else {
    uStack_c = basePrimary & 0xffff0000 | iVar1 * 0x100;
  }
  return uStack_c;
}

Assistant:

uint32_t
Collation::decThreeBytePrimaryByOneStep(uint32_t basePrimary, UBool isCompressible, int32_t step) {
    // Extract the third byte, minus the minimum byte value,
    // minus the step, modulo the number of usable byte values, plus the minimum.
    U_ASSERT(0 < step && step <= 0x7f);
    int32_t byte3 = ((int32_t)(basePrimary >> 8) & 0xff) - step;
    if(byte3 >= 2) {
        return (basePrimary & 0xffff0000) | ((uint32_t)byte3 << 8);
    }
    byte3 += 254;
    // Same with the second byte,
    // but reserve the PRIMARY_COMPRESSION_LOW_BYTE and high byte if necessary.
    int32_t byte2 = ((int32_t)(basePrimary >> 16) & 0xff) - 1;
    if(isCompressible) {
        if(byte2 < 4) {
            byte2 = 0xfe;
            basePrimary -= 0x1000000;
        }
    } else {
        if(byte2 < 2) {
            byte2 = 0xff;
            basePrimary -= 0x1000000;
        }
    }
    // First byte, assume no further underflow.
    return (basePrimary & 0xff000000) | ((uint32_t)byte2 << 16) | ((uint32_t)byte3 << 8);
}